

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O0

unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> __thiscall
spvtools::opt::InstrumentPass::EndFunction(InstrumentPass *this)

{
  DefUseManager *this_00;
  pointer inst;
  Pass *in_RSI;
  initializer_list<spvtools::opt::Operand> local_48;
  int local_34 [3];
  IRContext *local_28;
  undefined1 local_19;
  InstrumentPass *this_local;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> *end;
  
  local_19 = 0;
  this_local = this;
  local_28 = Pass::context(in_RSI);
  local_34[2] = 0x38;
  local_34[1] = 0;
  local_34[0] = 0;
  std::initializer_list<spvtools::opt::Operand>::initializer_list(&local_48);
  MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
            ((spvtools *)this,&local_28,(Op *)(local_34 + 2),local_34 + 1,local_34,&local_48);
  this_00 = Pass::get_def_use_mgr(in_RSI);
  inst = std::
         unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
         get((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              *)this);
  analysis::DefUseManager::AnalyzeInstDefUse(this_00,inst);
  return (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Instruction> InstrumentPass::EndFunction() {
  auto end = MakeUnique<Instruction>(context(), spv::Op::OpFunctionEnd, 0, 0,
                                     std::initializer_list<Operand>{});
  get_def_use_mgr()->AnalyzeInstDefUse(end.get());
  return end;
}